

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Irrlicht.cpp
# Opt level: O0

IrrlichtDevice *
createDevice(E_DRIVER_TYPE driverType,dimension2d<unsigned_int> *windowSize,u32 bits,bool fullscreen
            ,bool stencilbuffer,bool vsync,IEventReceiver *res)

{
  IrrlichtDevice *pIVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  SIrrlichtCreationParameters p;
  
  irr::SIrrlichtCreationParameters::SIrrlichtCreationParameters
            ((SIrrlichtCreationParameters *)CONCAT44(in_EDX,in_ECX));
  pIVar1 = createDeviceEx((SIrrlichtCreationParameters *)CONCAT44(in_EDX,in_ECX));
  irr::SIrrlichtCreationParameters::~SIrrlichtCreationParameters
            ((SIrrlichtCreationParameters *)0x39af60);
  return pIVar1;
}

Assistant:

createDevice(video::E_DRIVER_TYPE driverType,
		const core::dimension2d<u32> &windowSize,
		u32 bits, bool fullscreen,
		bool stencilbuffer, bool vsync, IEventReceiver *res)
{
	(void)copyright; // prevent unused variable warning

	SIrrlichtCreationParameters p;
	p.DriverType = driverType;
	p.WindowSize = windowSize;
	p.Bits = (u8)bits;
	p.Fullscreen = fullscreen;
	p.Stencilbuffer = stencilbuffer;
	p.Vsync = vsync;
	p.EventReceiver = res;

	return createDeviceEx(p);
}